

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_1::ViewportCallOrderCase::init
          (ViewportCallOrderCase *this,EVP_PKEY_CTX *ctx)

{
  MovePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> *this_00;
  pointer *this_01;
  uint uVar1;
  Context *pCVar2;
  RenderContext *renderCtx;
  PtrData<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
  data_00;
  PtrData<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> data_01;
  bool bVar3;
  ContextType ctxType;
  int iVar4;
  int iVar5;
  deUint32 err;
  undefined4 extraout_var;
  ulong uVar7;
  ulong uVar8;
  TypedObjectWrapper<(glu::ObjectType)1> *this_02;
  ShaderProgram *pSVar9;
  ProgramSources *pPVar10;
  TestLog *pTVar11;
  TestError *this_03;
  NotSupportedError *pNVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  void *__buf;
  char *pcVar16;
  int ndx;
  long lVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  undefined8 uStack_368;
  vector<int,_std::allocator<int>_> cellOrder;
  Random rnd;
  undefined1 local_310 [40];
  UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> local_2e8;
  undefined1 local_2d8 [40];
  Context *local_2b0 [4];
  string local_290;
  Context *local_270 [4];
  string local_250;
  Context *local_230 [4];
  string local_210;
  Context *local_1f0 [4];
  string local_1d0;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> data;
  long lVar6;
  
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar3 = glu::contextSupports(ctxType,(ApiType)0x23);
  if (!bVar3) {
    bVar3 = glu::ContextInfo::isExtensionSupported
                      (((this->super_TestCase).m_context)->m_contextInfo,
                       "GL_EXT_primitive_bounding_box");
    if (!bVar3) {
      pNVar12 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&data,"Test requires GL_EXT_primitive_bounding_box extension",
                 (allocator<char> *)&cellOrder);
      tcu::NotSupportedError::NotSupportedError(pNVar12,(string *)&data);
      __cxa_throw(pNVar12,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    bVar3 = glu::ContextInfo::isExtensionSupported
                      (((this->super_TestCase).m_context)->m_contextInfo,
                       "GL_EXT_tessellation_shader");
    if (!bVar3) {
      pNVar12 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&data,"Test requires GL_EXT_tessellation_shader extension",
                 (allocator<char> *)&cellOrder);
      tcu::NotSupportedError::NotSupportedError(pNVar12,(string *)&data);
      __cxa_throw(pNVar12,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_01 = &data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_01);
  std::operator<<((ostream *)this_01,
                  "Testing call order of state setting functions have no effect on the rendering.\n"
                 );
  std::operator<<((ostream *)this_01,"Setting viewport and bounding box in the following order:\n");
  pcVar16 = "\tFirst bounding box with glPrimitiveBoundingBoxEXT function.\n";
  if (this->m_callOrder == VIEWPORT_FIRST) {
    pcVar16 = "\tFirst viewport with glViewport function.\n";
  }
  std::operator<<((ostream *)this_01,pcVar16);
  pcVar16 = "\tThen viewport with glViewport function.\n";
  if (this->m_callOrder == VIEWPORT_FIRST) {
    pcVar16 = "\tThen bounding box with glPrimitiveBoundingBoxEXT function.\n";
  }
  std::operator<<((ostream *)this_01,pcVar16);
  std::operator<<((ostream *)this_01,"Verifying rendering result.");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&data,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_01);
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar4);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&data,0xd8,(allocator_type *)&cellOrder);
  std::vector<int,_std::allocator<int>_>::vector(&cellOrder,0x48,(allocator_type *)&rnd);
  deRandom_init(&rnd.m_rnd,0x55443322);
  uVar7 = (ulong)((long)cellOrder.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)cellOrder.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start) >> 2;
  uVar13 = 0;
  uVar8 = uVar7 & 0xffffffff;
  if ((int)uVar7 < 1) {
    uVar8 = uVar13;
  }
  for (; uVar8 != uVar13; uVar13 = uVar13 + 1) {
    cellOrder.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [uVar13] = (int)uVar13;
  }
  de::Random::shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            (&rnd,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                  cellOrder.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             cellOrder.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish);
  iVar4 = 1;
  for (lVar17 = 0;
      lVar17 < (int)((ulong)((long)cellOrder.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                            (long)cellOrder.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start) >> 2); lVar17 = lVar17 + 1) {
    uVar1 = cellOrder.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar17];
    iVar14 = (int)((long)((ulong)(uint)((int)((long)(int)uVar1 / 2) >> 0x1f) << 0x20 |
                         (long)(int)uVar1 / 2 & 0xffffffffU) % 6);
    iVar5 = (int)uVar1 / 0xc;
    fVar18 = (float)iVar14 / 6.0;
    fVar20 = (float)iVar5 / 6.0 + (float)iVar5 / 6.0 + -1.0;
    iVar15 = iVar4 + -1;
    data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
    super__Vector_impl_data._M_start[iVar15].m_data[0] = fVar18;
    data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
    super__Vector_impl_data._M_start[iVar15].m_data[1] = fVar20;
    data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
    super__Vector_impl_data._M_start[iVar15].m_data[2] = 0.0;
    data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
    super__Vector_impl_data._M_start[iVar15].m_data[3] = 1.0;
    fVar19 = (float)(iVar14 + 1) / 6.0;
    if ((uVar1 & 1) == 0) {
      fVar20 = (float)(iVar5 + 1) / 6.0;
      fVar20 = fVar20 + fVar20 + -1.0;
      data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[iVar4].m_data[0] = fVar19;
      data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[iVar4].m_data[1] = fVar20;
      data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[iVar4].m_data[2] = 0.0;
      data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[iVar4].m_data[3] = 1.0;
      fVar19 = fVar18;
    }
    else {
      data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[iVar4].m_data[0] = fVar19;
      data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[iVar4].m_data[1] = fVar20;
      data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[iVar4].m_data[2] = 0.0;
      data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[iVar4].m_data[3] = 1.0;
      fVar18 = (float)(iVar5 + 1) / 6.0;
      fVar20 = fVar18 + fVar18 + -1.0;
    }
    iVar5 = iVar4 + 1;
    data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
    super__Vector_impl_data._M_start[iVar5].m_data[0] = fVar19;
    data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
    super__Vector_impl_data._M_start[iVar5].m_data[1] = fVar20;
    data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
    super__Vector_impl_data._M_start[iVar5].m_data[2] = 0.0;
    data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
    super__Vector_impl_data._M_start[iVar5].m_data[3] = 1.0;
    iVar4 = iVar4 + 3;
  }
  this_02 = (TypedObjectWrapper<(glu::ObjectType)1> *)operator_new(0x18);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            (this_02,((this->super_TestCase).m_context)->m_renderCtx);
  local_310._0_8_ = (TypedObjectWrapper<(glu::ObjectType)1> *)0x0;
  data_00._8_8_ =
       cellOrder.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start;
  data_00.ptr = (TypedObjectWrapper<(glu::ObjectType)1> *)uStack_368;
  de::details::
  UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
  ::assignData(&(this->m_vbo).
                super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
               ,data_00);
  de::details::
  UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
  ::~UniqueBase((UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
                 *)local_310);
  (**(code **)(lVar6 + 0x40))
            (0x8892,(((this->m_vbo).
                      super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
                      .m_data.ptr)->super_ObjectWrapper).m_object);
  (**(code **)(lVar6 + 0x150))
            (0x8892,(long)((int)data.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (int)data.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) & 0xfffffffffffffff0,
             data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_start,0x88e4);
  err = (**(code **)(lVar6 + 0x800))();
  pcVar16 = (char *)0x12cd;
  glu::checkError(err,"create vbo",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                  ,0x12cd);
  this->m_numVertices =
       (int)((ulong)(CONCAT44(data.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                              (int)data.
                                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish) -
                    (long)data.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 4);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&cellOrder.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
            (&data.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
  pSVar9 = (ShaderProgram *)operator_new(0xd0);
  pCVar2 = (this->super_TestCase).m_context;
  renderCtx = pCVar2->m_renderCtx;
  memset(&data,0,0xac);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1f0,
             "${GLSL_VERSION_DECL}\nin highp vec4 a_position;\nout highp vec4 v_vertex_color;\nvoid main()\n{\n\tgl_Position = a_position;\n\t// yellowish shade\n\thighp float redComponent = 0.5 + float(gl_VertexID % 5) / 8.0;\n\tv_vertex_color = vec4(redComponent, 1.0, 0.0, 1.0);\n}\n"
             ,(allocator<char> *)&rnd);
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_1d0,(_anonymous_namespace_ *)pCVar2,local_1f0[0],pcVar16);
  glu::VertexSource::VertexSource((VertexSource *)&cellOrder,&local_1d0);
  pPVar10 = glu::ProgramSources::operator<<((ProgramSources *)&data,(ShaderSource *)&cellOrder);
  pCVar2 = (this->super_TestCase).m_context;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_230,
             "${GLSL_VERSION_DECL}\nin mediump vec4 v_color;\nlayout(location = 0) out mediump vec4 o_color;\nvoid main()\n{\n\to_color = v_color;\n}\n"
             ,(allocator<char> *)local_310);
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_210,(_anonymous_namespace_ *)pCVar2,local_230[0],pcVar16);
  glu::FragmentSource::FragmentSource((FragmentSource *)&rnd,&local_210);
  pPVar10 = glu::ProgramSources::operator<<(pPVar10,(ShaderSource *)&rnd);
  pCVar2 = (this->super_TestCase).m_context;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_270,
             "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\nlayout(vertices=3) out;\nin highp vec4 v_vertex_color[];\nout highp vec4 v_tess_eval_color[];\nvoid main()\n{\n\tgl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n\tv_tess_eval_color[gl_InvocationID] = v_vertex_color[gl_InvocationID];\n\tgl_TessLevelOuter[0] = 2.8;\n\tgl_TessLevelOuter[1] = 2.8;\n\tgl_TessLevelOuter[2] = 2.8;\n\tgl_TessLevelInner[0] = 2.8;\n}\n"
             ,(allocator<char> *)local_2d8);
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_250,(_anonymous_namespace_ *)pCVar2,local_270[0],pcVar16);
  glu::TessellationControlSource::TessellationControlSource
            ((TessellationControlSource *)local_310,&local_250);
  pPVar10 = glu::ProgramSources::operator<<(pPVar10,(ShaderSource *)local_310);
  pCVar2 = (this->super_TestCase).m_context;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2b0,
             "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\n${GPU_SHADER5_REQUIRE}\nlayout(triangles) in;\nin highp vec4 v_tess_eval_color[];\nout highp vec4 v_color;\nprecise gl_Position;\nvoid main()\n{\n\tgl_Position = gl_TessCoord.x * gl_in[0].gl_Position\n\t            + gl_TessCoord.y * gl_in[1].gl_Position\n\t            + gl_TessCoord.z * gl_in[2].gl_Position;\n\tv_color = gl_TessCoord.x * v_tess_eval_color[0]\n\t        + gl_TessCoord.y * v_tess_eval_color[1]\n\t        + gl_TessCoord.z * v_tess_eval_color[2];\n}\n"
             ,(allocator<char> *)((long)&uStack_368 + 7));
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_290,(_anonymous_namespace_ *)pCVar2,local_2b0[0],pcVar16);
  glu::TessellationEvaluationSource::TessellationEvaluationSource
            ((TessellationEvaluationSource *)local_2d8,&local_290);
  pPVar10 = glu::ProgramSources::operator<<(pPVar10,(ShaderSource *)local_2d8);
  glu::ShaderProgram::ShaderProgram(pSVar9,renderCtx,pPVar10);
  local_2e8.m_data.ptr = (ShaderProgram *)0x0;
  this_00 = &this->m_program;
  data_01._8_8_ =
       cellOrder.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start;
  data_01.ptr = uStack_368;
  de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::assignData
            (&this_00->super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
             ,data_01);
  de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::~UniqueBase
            (&local_2e8);
  std::__cxx11::string::~string((string *)(local_2d8 + 8));
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)local_2b0);
  std::__cxx11::string::~string((string *)(local_310 + 8));
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)local_270);
  std::__cxx11::string::~string((string *)&rnd.m_rnd.z);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)local_230);
  std::__cxx11::string::~string
            ((string *)
             &cellOrder.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)local_1f0);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&data);
  pTVar11 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cellOrder,"Program",(allocator<char> *)local_310);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&rnd,"Shader program",(allocator<char> *)local_2d8);
  tcu::LogSection::LogSection((LogSection *)&data,(string *)&cellOrder,(string *)&rnd);
  tcu::LogSection::write((LogSection *)&data,(int)pTVar11,__buf,(size_t)pcVar16);
  pTVar11 = glu::operator<<(pTVar11,(this_00->
                                    super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                                    ).m_data.ptr);
  tcu::TestLog::endSection(pTVar11);
  tcu::LogSection::~LogSection((LogSection *)&data);
  std::__cxx11::string::~string((string *)&rnd);
  std::__cxx11::string::~string((string *)&cellOrder);
  pSVar9 = (this_00->super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>).
           m_data.ptr;
  if ((pSVar9->m_program).m_info.linkOk != false) {
    return (int)pSVar9;
  }
  this_03 = (TestError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&data,"shader build failed",(allocator<char> *)&cellOrder);
  tcu::TestError::TestError(this_03,(string *)&data);
  __cxa_throw(this_03,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void ViewportCallOrderCase::init (void)
{
	const bool supportsES32 = glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	if (!supportsES32 && !m_context.getContextInfo().isExtensionSupported("GL_EXT_primitive_bounding_box"))
		throw tcu::NotSupportedError("Test requires GL_EXT_primitive_bounding_box extension");

	if (!supportsES32 && !m_context.getContextInfo().isExtensionSupported("GL_EXT_tessellation_shader"))
		throw tcu::NotSupportedError("Test requires GL_EXT_tessellation_shader extension");

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Testing call order of state setting functions have no effect on the rendering.\n"
		<< "Setting viewport and bounding box in the following order:\n"
			<< ((m_callOrder == VIEWPORT_FIRST)
				? ("\tFirst viewport with glViewport function.\n")
				: ("\tFirst bounding box with glPrimitiveBoundingBoxEXT function.\n"))
			<< ((m_callOrder == VIEWPORT_FIRST)
				? ("\tThen bounding box with glPrimitiveBoundingBoxEXT function.\n")
				: ("\tThen viewport with glViewport function.\n"))
		<< "Verifying rendering result."
		<< tcu::TestLog::EndMessage;

	// resources
	genVbo();
	genProgram();
}